

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsExecutableWithExports(cmGeneratorTarget *this)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  if (this->Target->TargetTypeValue == EXECUTABLE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"ENABLE_EXPORTS",&local_31);
    bVar1 = GetPropertyAsBool(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}